

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

string * __thiscall
leveldb::RecoveryTest::ManifestFileName_abi_cxx11_
          (string *__return_storage_ptr__,RecoveryTest *this)

{
  Env *env;
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Status local_208;
  string local_200;
  string local_1e0;
  Tester local_1c0;
  
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1c0.line_ = 0x57;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  env = this->env_;
  CurrentFileName(&local_1e0,&this->dbname_);
  ReadFileToString((leveldb *)&local_208,env,&local_1e0,&local_200);
  test::Tester::IsOk(&local_1c0,&local_208);
  if (local_208.state_ != (char *)0x0) {
    operator_delete__(local_208.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1c0);
  if ((local_200._M_string_length != 0) &&
     (local_200._M_dataplus._M_p[local_200._M_string_length - 1] == '\n')) {
    std::__cxx11::string::resize((ulong)&local_200,(char)local_200._M_string_length + -1);
  }
  pcVar1 = (this->dbname_)._M_dataplus._M_p;
  local_1c0._0_8_ = (void *)((long)&local_1c0 + 0x10U);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + (this->dbname_)._M_string_length);
  std::__cxx11::string::append(&local_1c0.ok_);
  plVar3 = (long *)std::__cxx11::string::_M_append(&local_1c0.ok_,(ulong)local_200._M_dataplus._M_p)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((void *)local_1c0._0_8_ != (void *)((long)&local_1c0 + 0x10U)) {
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ManifestFileName() {
    std::string current;
    ASSERT_OK(ReadFileToString(env_, CurrentFileName(dbname_), &current));
    size_t len = current.size();
    if (len > 0 && current[len - 1] == '\n') {
      current.resize(len - 1);
    }
    return dbname_ + "/" + current;
  }